

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::Initialize
               (int order,int dimension,MShapeType shapetype,TPZShapeData *data)

{
  int iVar1;
  int *piVar2;
  long in_RCX;
  int in_EDI;
  int64_t nshape;
  int64_t in_stack_00000048;
  int64_t in_stack_00000050;
  TPZFMatrix<double> *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  TPZVec<long> *in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffff0;
  
  TPZVec<int>::resize((TPZVec<int> *)in_stack_ffffffffffffffe0,
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x70),0);
  *piVar2 = in_EDI;
  TPZVec<long>::resize(in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,in_EDI));
  TPZVec<int>::resize((TPZVec<int> *)in_stack_ffffffffffffffe0,
                      CONCAT44(in_stack_ffffffffffffffdc,in_EDI));
  iVar1 = NShapeF(in_stack_fffffffffffffff0,(int)((ulong)in_RCX >> 0x20),(MShapeType)in_RCX);
  piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x100),0);
  *piVar2 = iVar1;
  TPZFMatrix<double>::Resize(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  TPZFMatrix<double>::Resize(in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void TPZShapeDisc::Initialize(int order, int dimension, MShapeType shapetype, TPZShapeData &data)
{
    data.fH1ConnectOrders.resize(1);
    data.fH1ConnectOrders[0] = order;
    data.fCornerNodeIds.resize(0);
    data.fH1NumConnectShape.resize(1);
    int64_t nshape = NShapeF(order, dimension, shapetype);
    data.fH1NumConnectShape[0] = nshape;
    data.fPhi.Resize(nshape,1);
    data.fDPhi.Resize(dimension, nshape);

}